

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_negation_int_min_Test::TestBody(correctness_negation_int_min_Test *this)

{
  bool bVar1;
  int x;
  char *message;
  AssertHelper local_e8;
  Message local_e0;
  big_integer local_d8;
  big_integer local_b8;
  big_integer local_98;
  int local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  undefined1 local_50 [8];
  big_integer b;
  big_integer a;
  correctness_negation_int_min_Test *this_local;
  
  x = std::numeric_limits<int>::min();
  big_integer::big_integer((big_integer *)&b.sign,x);
  big_integer::operator-((big_integer *)local_50,(big_integer *)&b.sign);
  local_74 = std::numeric_limits<int>::max();
  big_integer::big_integer(&local_b8,(big_integer *)local_50);
  big_integer::big_integer(&local_d8,1);
  ::operator-(&local_98,&local_b8,&local_d8);
  testing::internal::EqHelper<false>::Compare<int,big_integer>
            ((EqHelper<false> *)local_70,"std::numeric_limits<int>::max()","b - 1",&local_74,
             &local_98);
  big_integer::~big_integer(&local_98);
  big_integer::~big_integer(&local_d8);
  big_integer::~big_integer(&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/maxLundin[P]BigInteger/big_integer_testing.cpp"
               ,0x10f,message);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  big_integer::~big_integer((big_integer *)local_50);
  big_integer::~big_integer((big_integer *)&b.sign);
  return;
}

Assistant:

TEST(correctness, negation_int_min) {
    big_integer a = std::numeric_limits<int>::min();
    big_integer b = -a;

    EXPECT_EQ(std::numeric_limits<int>::max(), b - 1);
}